

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeFabricVertexGetExp
          (ze_driver_handle_t hDriver,uint32_t *pCount,ze_fabric_vertex_handle_t *phVertices)

{
  object_t<_ze_fabric_vertex_handle_t_*> *poVar1;
  bool bVar2;
  bad_alloc *anon_var_0;
  ulong local_48;
  size_t i;
  ze_pfnFabricVertexGetExp_t pfnGetExp;
  dditable_t *dditable;
  ze_fabric_vertex_handle_t *pp_Stack_28;
  ze_result_t result;
  ze_fabric_vertex_handle_t *phVertices_local;
  uint32_t *pCount_local;
  ze_driver_handle_t hDriver_local;
  
  dditable._4_4_ = 0;
  pfnGetExp = *(ze_pfnFabricVertexGetExp_t *)(hDriver + 8);
  if (*(code **)(pfnGetExp + 0x620) == (code *)0x0) {
    hDriver_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pCount_local = *(uint32_t **)hDriver;
    pp_Stack_28 = phVertices;
    phVertices_local = (ze_fabric_vertex_handle_t *)pCount;
    dditable._4_4_ = (**(code **)(pfnGetExp + 0x620))(pCount_local,pCount,phVertices);
    hDriver_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      local_48 = 0;
      while( true ) {
        bVar2 = false;
        if (pp_Stack_28 != (ze_fabric_vertex_handle_t *)0x0) {
          bVar2 = local_48 < *(uint *)phVertices_local;
        }
        if (!bVar2) break;
        poVar1 = singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                 ::getInstance<_ze_fabric_vertex_handle_t*&,dditable_t*&>
                           ((singleton_factory_t<object_t<_ze_fabric_vertex_handle_t*>,_ze_fabric_vertex_handle_t*>
                             *)(context + 0x360),pp_Stack_28 + local_48,(dditable_t **)&pfnGetExp);
        pp_Stack_28[local_48] = (ze_fabric_vertex_handle_t)poVar1;
        local_48 = local_48 + 1;
      }
      hDriver_local._4_4_ = dditable._4_4_;
    }
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetExp(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric vertices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric vertices available.
                                                        ///< if count is greater than the number of fabric vertices available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< vertices available.
        ze_fabric_vertex_handle_t* phVertices           ///< [in,out][optional][range(0, *pCount)] array of handle of fabric vertices.
                                                        ///< if count is less than the number of fabric vertices available, then
                                                        ///< driver shall only retrieve that number of fabric vertices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_driver_object_t*>( hDriver )->dditable;
        auto pfnGetExp = dditable->ze.FabricVertexExp.pfnGetExp;
        if( nullptr == pfnGetExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<ze_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetExp( hDriver, pCount, phVertices );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handles to loader handles
            for( size_t i = 0; ( nullptr != phVertices ) && ( i < *pCount ); ++i )
                phVertices[ i ] = reinterpret_cast<ze_fabric_vertex_handle_t>(
                    context->ze_fabric_vertex_factory.getInstance( phVertices[ i ], dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }